

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rom.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_32777e::Nrom_creation_works_with_correct_rom_sizes_Test::TestBody
          (Nrom_creation_works_with_correct_rom_sizes_Test *this)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  char *pcVar3;
  Mapper in_R8D;
  Mapper mapper;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *val2;
  AssertHelper local_3d0;
  Message local_3c8;
  void *local_3c0;
  undefined1 local_3b8 [8];
  AssertionResult gtest_ar_1;
  stringstream local_3a0 [392];
  string local_218;
  AssertHelper local_1f8;
  Message local_1f0;
  void *local_1e8;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar;
  unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_> nrom;
  stringstream local_1b8 [8];
  stringstream ss;
  undefined1 local_30 [8];
  string bytes;
  Nrom_creation_works_with_correct_rom_sizes_Test *this_local;
  
  bytes.field_2._8_8_ = this;
  (anonymous_namespace)::nrom_bytes_abi_cxx11_
            ((string *)local_30,(_anonymous_namespace_ *)0x1,'\x01','\0',in_R8D);
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_1b8,(string *)local_30,_Var2);
  n_e_s::core::RomFactory::from_bytes((RomFactory *)&gtest_ar.message_,(istream *)local_1b8);
  local_1e8 = (void *)0x0;
  val2 = &gtest_ar.message_;
  testing::internal::
  CmpHelperNE<decltype(nullptr),std::unique_ptr<n_e_s::core::IRom,std::default_delete<n_e_s::core::IRom>>>
            ((internal *)local_1e0,"nullptr","nrom",&local_1e8,
             (unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_> *)val2);
  mapper = (Mapper)val2;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
  if (!bVar1) {
    testing::Message::Message(&local_1f0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1e0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_rom.cpp"
               ,0x59,pcVar3);
    mapper = (Mapper)pcVar3;
    testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&local_1f8);
    testing::Message::~Message(&local_1f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
  (anonymous_namespace)::nrom_bytes_abi_cxx11_
            (&local_218,(_anonymous_namespace_ *)0x2,'\x01','\0',mapper);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
             &local_218);
  std::__cxx11::string::~string((string *)&local_218);
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_3a0,(string *)local_30,_Var2);
  std::__cxx11::stringstream::operator=(local_1b8,local_3a0);
  std::__cxx11::stringstream::~stringstream(local_3a0);
  n_e_s::core::RomFactory::from_bytes((RomFactory *)&gtest_ar_1.message_,(istream *)local_1b8);
  std::unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_>::operator=
            ((unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_> *)
             &gtest_ar.message_,
             (unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_> *)
             &gtest_ar_1.message_);
  std::unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_>::~unique_ptr
            ((unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_> *)
             &gtest_ar_1.message_);
  local_3c0 = (void *)0x0;
  testing::internal::
  CmpHelperNE<decltype(nullptr),std::unique_ptr<n_e_s::core::IRom,std::default_delete<n_e_s::core::IRom>>>
            ((internal *)local_3b8,"nullptr","nrom",&local_3c0,
             (unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_> *)
             &gtest_ar.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b8);
  if (!bVar1) {
    testing::Message::Message(&local_3c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_3d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_rom.cpp"
               ,0x5e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3d0,&local_3c8);
    testing::internal::AssertHelper::~AssertHelper(&local_3d0);
    testing::Message::~Message(&local_3c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b8);
  std::unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_>::~unique_ptr
            ((unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_> *)
             &gtest_ar.message_);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(Nrom, creation_works_with_correct_rom_sizes) {
    std::string bytes{nrom_bytes(1, 1, Mapper::Nrom)};
    std::stringstream ss(bytes);
    std::unique_ptr<IRom> nrom{RomFactory::from_bytes(ss)};
    EXPECT_NE(nullptr, nrom);

    bytes = nrom_bytes(2, 1, Mapper::Nrom);
    ss = std::stringstream(bytes);
    nrom = RomFactory::from_bytes(ss);
    EXPECT_NE(nullptr, nrom);
}